

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadProcessGroup.h
# Opt level: O0

void __thiscall
IlmThread_3_4::ProcessGroup<Imf_3_4::(anonymous_namespace)::TileProcess,_true>::push
          (ProcessGroup<Imf_3_4::(anonymous_namespace)::TileProcess,_true> *this,Process *p)

{
  bool bVar1;
  __pointer_type pTVar2;
  long in_RSI;
  undefined8 in_RDI;
  Process *oldhead;
  memory_order in_stack_00000060;
  memory_order in_stack_00000064;
  __pointer_type in_stack_00000068;
  __pointer_type *in_stack_00000070;
  atomic<Imf_3_4::(anonymous_namespace)::TileProcess_*> *in_stack_00000078;
  atomic<Imf_3_4::(anonymous_namespace)::TileProcess_*> *in_stack_ffffffffffffffe8;
  
  pTVar2 = std::atomic<Imf_3_4::(anonymous_namespace)::TileProcess_*>::load
                     (in_stack_ffffffffffffffe8,(memory_order)((ulong)in_RDI >> 0x20));
  do {
    *(__pointer_type *)(in_RSI + 0x240) = pTVar2;
    bVar1 = std::atomic<Imf_3_4::(anonymous_namespace)::TileProcess_*>::compare_exchange_weak
                      (in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000064,
                       in_stack_00000060);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  IlmThread_3_4::Semaphore::post();
  return;
}

Assistant:

void push (Process *p)
    {
        Process* oldhead = _avail_head.load (std::memory_order_relaxed);

        do
        {
            p->next = oldhead;
        } while (!_avail_head.compare_exchange_weak (
                     oldhead, p,
                     std::memory_order_release,
                     std::memory_order_relaxed));

        // notify someone else there's one available
        _sem.post ();
    }